

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O3

void __thiscall UniValue::writeArray(UniValue *this,uint prettyIndent,uint indentLevel,string *s)

{
  long lVar1;
  int iVar2;
  ulong uVar4;
  void *__buf;
  ulong uVar5;
  long in_FS_OFFSET;
  bool bVar6;
  size_type *local_58;
  _Alloc_hider local_50;
  size_type local_48 [3];
  pointer pUVar3;
  
  local_48[2] = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(s,"[");
  if (prettyIndent != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(s,"\n");
  }
  pUVar3 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish != pUVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      iVar2 = (int)pUVar3;
      if (prettyIndent == 0) {
        __buf = (void *)0x0;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace_aux(s,s->_M_string_length,0,(ulong)(indentLevel * prettyIndent),' ');
        iVar2 = (int)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_start;
        __buf = (void *)(ulong)prettyIndent;
      }
      write_abi_cxx11_((UniValue *)&local_58,(int)uVar4 * 0x58 + iVar2,__buf,
                       (ulong)(indentLevel + 1));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (s,(char *)local_58,(size_type)local_50._M_p);
      if (local_58 != local_48) {
        operator_delete(local_58,local_48[0] + 1);
      }
      if (((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 - 1U != uVar4) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (s,",");
      }
      if (prettyIndent != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (s,"\n");
      }
      pUVar3 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pUVar3 >> 3) * 0x2e8ba2e8ba2e8ba3;
      bVar6 = uVar5 <= uVar4;
      lVar1 = uVar4 - uVar5;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar6 && lVar1 != 0);
  }
  if (prettyIndent != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (s,s->_M_string_length,0,(ulong)((indentLevel - 1) * prettyIndent),' ');
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(s,"]");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_48[2]) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::writeArray(unsigned int prettyIndent, unsigned int indentLevel, std::string& s) const
{
    s += "[";
    if (prettyIndent)
        s += "\n";

    for (unsigned int i = 0; i < values.size(); i++) {
        if (prettyIndent)
            indentStr(prettyIndent, indentLevel, s);
        s += values[i].write(prettyIndent, indentLevel + 1);
        if (i != (values.size() - 1)) {
            s += ",";
        }
        if (prettyIndent)
            s += "\n";
    }

    if (prettyIndent)
        indentStr(prettyIndent, indentLevel - 1, s);
    s += "]";
}